

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_specialpaths.cpp
# Opt level: O0

FString M_GetCajunPath(char *botfilename)

{
  bool bVar1;
  char *pcVar2;
  char *in_RSI;
  FString local_28;
  undefined1 local_19;
  char *local_18;
  char *botfilename_local;
  FString *path;
  
  local_19 = 0;
  local_18 = in_RSI;
  botfilename_local = botfilename;
  FString::FString((FString *)botfilename);
  GetUserFile((char *)&local_28);
  FString::operator=((FString *)botfilename,&local_28);
  FString::~FString(&local_28);
  pcVar2 = FString::operator_cast_to_char_((FString *)botfilename);
  bVar1 = FileExists(pcVar2);
  if (!bVar1) {
    FString::operator=((FString *)botfilename,"/usr/local/share/");
    FString::operator<<((FString *)botfilename,local_18);
    pcVar2 = FString::operator_cast_to_char_((FString *)botfilename);
    bVar1 = FileExists(pcVar2);
    if (!bVar1) {
      FString::operator=((FString *)botfilename,"");
    }
  }
  return (FString)botfilename;
}

Assistant:

FString M_GetCajunPath(const char *botfilename)
{
	FString path;

	// Check first in ~/.config/zdoom/botfilename.
	path = GetUserFile(botfilename);
	if (!FileExists(path))
	{
		// Then check in SHARE_DIR/botfilename.
		path = SHARE_DIR;
		path << botfilename;
		if (!FileExists(path))
		{
			path = "";
		}
	}
	return path;
}